

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O1

uv_os_sock_t create_bound_socket(sockaddr_in bind_addr)

{
  long lVar1;
  long *plVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uv_os_sock_t extraout_EAX;
  uv_os_sock_t extraout_EAX_00;
  uv_os_sock_t extraout_EAX_01;
  uv_os_sock_t extraout_EAX_02;
  connection_context_t *pcVar6;
  void *pvVar7;
  ssize_t sVar8;
  int *piVar9;
  uint extraout_EDX;
  uint uVar10;
  ulong unaff_RBX;
  sockaddr *__addr;
  void *pvVar11;
  long *plVar12;
  long *plVar13;
  long *plVar14;
  undefined8 *__ptr;
  ulong uVar15;
  size_t sVar16;
  int yes;
  socklen_t sStack_44;
  sockaddr sStack_40;
  code *pcStack_30;
  undefined4 local_1c;
  sockaddr local_18;
  
  plVar12 = (long *)0x2;
  pcStack_30 = (code *)0x173e15;
  uVar3 = socket(2,1,0);
  if ((int)uVar3 < 0) {
    pcStack_30 = (code *)0x173e63;
    create_bound_socket_cold_1();
LAB_00173e63:
    pcStack_30 = (code *)0x173e68;
    create_bound_socket_cold_2();
  }
  else {
    unaff_RBX = (ulong)uVar3;
    local_1c = 1;
    plVar12 = (long *)(ulong)uVar3;
    pcStack_30 = (code *)0x173e3d;
    iVar4 = setsockopt(uVar3,1,2,&local_1c,4);
    if (iVar4 != 0) goto LAB_00173e63;
    plVar12 = (long *)(ulong)uVar3;
    pcStack_30 = (code *)0x173e52;
    iVar4 = bind(uVar3,&local_18,0x10);
    if (iVar4 == 0) {
      return uVar3;
    }
  }
  pcStack_30 = server_poll_cb;
  create_bound_socket_cold_3();
  lVar1 = *plVar12;
  sStack_44 = 0x10;
  pcVar6 = (connection_context_t *)(ulong)*(uint *)(lVar1 + 0xa0);
  __addr = &sStack_40;
  pcStack_30 = (code *)unaff_RBX;
  iVar4 = accept(*(uint *)(lVar1 + 0xa0),__addr,&sStack_44);
  iVar5 = (int)__addr;
  if (iVar4 < 0) {
    server_poll_cb_cold_1();
  }
  else {
    pcVar6 = create_connection_context(iVar4,1);
    pcVar6->events = 7;
    iVar5 = 7;
    iVar4 = uv_poll_start(pcVar6,7,connection_poll_cb);
    if (iVar4 == 0) {
      iVar4 = *(int *)(lVar1 + 0xa4) + 1;
      *(int *)(lVar1 + 0xa4) = iVar4;
      if (iVar4 == 5) {
        close_socket(*(uv_os_sock_t *)(lVar1 + 0xa0));
        iVar4 = uv_close(lVar1,server_close_cb);
      }
      return iVar4;
    }
  }
  server_poll_cb_cold_2();
  plVar12 = (long *)0x170;
  iVar4 = iVar5;
  pvVar7 = malloc(0x170);
  if (pvVar7 == (void *)0x0) {
    create_connection_context_cold_3();
LAB_00173f97:
    create_connection_context_cold_1();
  }
  else {
    *(int *)((long)pvVar7 + 0x138) = (int)pcVar6;
    *(int *)((long)pvVar7 + 0x150) = iVar5;
    *(undefined8 *)((long)pvVar7 + 0x140) = 0;
    *(undefined8 *)((long)pvVar7 + 0x148) = 0;
    *(undefined8 *)((long)pvVar7 + 0x154) = 0;
    *(undefined8 *)((long)pvVar7 + 0x15c) = 0;
    *(undefined8 *)((long)pvVar7 + 0x164) = 0;
    plVar12 = (long *)uv_default_loop();
    pvVar11 = pvVar7;
    iVar5 = uv_poll_init_socket(plVar12,pvVar7,(ulong)pcVar6 & 0xffffffff);
    iVar4 = (int)pvVar11;
    *(int *)((long)pvVar7 + 0x154) = *(int *)((long)pvVar7 + 0x154) + 1;
    *(void **)pvVar7 = pvVar7;
    if (iVar5 != 0) goto LAB_00173f97;
    plVar12 = (long *)uv_default_loop();
    iVar4 = (int)pvVar7 + 0xa0;
    iVar5 = uv_timer_init();
    *(int *)((long)pvVar7 + 0x154) = *(int *)((long)pvVar7 + 0x154) + 1;
    *(void **)((long)pvVar7 + 0xa0) = pvVar7;
    if (iVar5 == 0) {
      return (int)pvVar7;
    }
  }
  create_connection_context_cold_2();
  plVar13 = plVar12;
  if (iVar4 == 0) {
    plVar2 = (long *)*plVar12;
    uVar3 = *(uint *)((long)plVar2 + 0x164);
    if ((uVar3 & extraout_EDX) == 0) goto LAB_00174559;
    if ((~uVar3 & extraout_EDX) == 0) {
      if ((extraout_EDX & 1) != 0) goto LAB_001740f0;
switchD_00174131_caseD_4:
      if ((extraout_EDX & 2) != 0) {
        if (((ulong)plVar2[0x29] < 0x10000) &&
           ((test_mode != '\x01' || (*(int *)(plVar2 + 0x2a) == 0)))) {
          iVar4 = rand();
          switch(iVar4 % 7) {
          case 0:
          case 1:
            uVar15 = -(plVar2[0x29] + -0x10000);
            sVar16 = 0x67;
            if (uVar15 < 0x67) {
              sVar16 = uVar15;
            }
            if (plVar2[0x29] == 0x10000) goto LAB_00174577;
            do {
              plVar13 = (long *)(ulong)*(uint *)(plVar2 + 0x27);
              sVar8 = send(*(uint *)(plVar2 + 0x27),connection_poll_cb::buffer_2,sVar16,0);
              uVar10 = (uint)sVar8;
              if (uVar10 != 0xffffffff) break;
              piVar9 = __errno_location();
            } while (*piVar9 == 4);
            if ((int)uVar10 < 0) {
              piVar9 = __errno_location();
              if ((*piVar9 != 0xb) && (*piVar9 != 0x73)) {
                connection_poll_cb_cold_13();
                goto LAB_001744e3;
              }
LAB_001744fc:
              spurious_writable_wakeups = spurious_writable_wakeups + 1;
            }
            else {
              if (uVar10 == 0) goto LAB_00174581;
              plVar2[0x29] = plVar2[0x29] + (ulong)(uVar10 & 0x7fffffff);
              valid_writable_wakeups = valid_writable_wakeups + 1;
            }
            break;
          case 2:
          case 3:
            sVar16 = -(plVar2[0x29] + -0x10000);
            if (0x4d1 < sVar16) {
              sVar16 = 0x4d2;
            }
            if (plVar2[0x29] == 0x10000) goto LAB_0017457c;
            do {
              plVar13 = (long *)(ulong)*(uint *)(plVar2 + 0x27);
              sVar8 = send(*(uint *)(plVar2 + 0x27),connection_poll_cb::buffer_3,sVar16,0);
              uVar10 = (uint)sVar8;
              if (uVar10 != 0xffffffff) break;
              piVar9 = __errno_location();
            } while (*piVar9 == 4);
            if ((int)uVar10 < 0) {
LAB_001744e3:
              piVar9 = __errno_location();
              if ((*piVar9 == 0xb) || (*piVar9 == 0x73)) goto LAB_001744fc;
              goto LAB_00174590;
            }
            if (uVar10 == 0) goto LAB_00174586;
            valid_writable_wakeups = valid_writable_wakeups + 1;
            uVar15 = (ulong)(uVar10 & 0x7fffffff) + plVar2[0x29];
            plVar2[0x29] = uVar15;
            while (uVar15 < 0x10000) {
              sVar16 = 0x10000 - uVar15;
              if (uVar15 < 0xfb2f) {
                sVar16 = 0x4d2;
              }
              do {
                plVar13 = (long *)(ulong)*(uint *)(plVar2 + 0x27);
                sVar8 = send(*(uint *)(plVar2 + 0x27),connection_poll_cb::buffer_3,sVar16,0);
                uVar10 = (uint)sVar8;
                if (uVar10 != 0xffffffff) break;
                piVar9 = __errno_location();
              } while (*piVar9 == 4);
              if (uVar10 == 0) {
LAB_0017454f:
                connection_poll_cb_cold_7();
                goto LAB_00174554;
              }
              if ((int)uVar10 < 0) {
                piVar9 = __errno_location();
                if ((*piVar9 != 0xb) && (*piVar9 != 0x73)) {
                  connection_poll_cb_cold_8();
                  goto LAB_0017454f;
                }
                break;
              }
              uVar15 = (ulong)(uVar10 & 0x7fffffff) + plVar2[0x29];
              plVar2[0x29] = uVar15;
            }
            break;
          case 4:
            break;
          case 5:
            uVar3 = uVar3 & 0xfffffffd;
            iVar4 = uv_is_active(plVar2 + 0x14);
            if (iVar4 == 0) {
              *(undefined4 *)(plVar2 + 0x2d) = 2;
              uv_timer_start(plVar2 + 0x14,delay_timer_cb,100,0);
            }
            else {
              *(byte *)(plVar2 + 0x2d) = *(byte *)(plVar2 + 0x2d) | 2;
            }
            break;
          case 6:
            uv_poll_start(plVar2,1,connection_poll_cb);
            uv_poll_start(plVar2,2,connection_poll_cb);
            *(undefined4 *)((long)plVar2 + 0x164) = 2;
            break;
          default:
            goto switchD_001741dd_default;
          }
        }
        else {
          plVar13 = (long *)(ulong)*(uint *)(plVar2 + 0x27);
          iVar4 = shutdown(*(uint *)(plVar2 + 0x27),1);
          if (iVar4 != 0) goto LAB_00174568;
          *(undefined4 *)((long)plVar2 + 0x15c) = 1;
          uVar3 = uVar3 & 0xfffffffd;
        }
      }
      if ((extraout_EDX & 4) != 0) {
        *(undefined4 *)(plVar2 + 0x2c) = 1;
        disconnects = disconnects + 1;
        uVar3 = uVar3 & 0xfffffffb;
      }
      if (((*(int *)(plVar2 + 0x2b) == 0) || (*(int *)((long)plVar2 + 0x15c) == 0)) ||
         (*(int *)(plVar2 + 0x2c) == 0)) {
        if (uVar3 != *(uint *)((long)plVar2 + 0x164)) {
          *(uint *)((long)plVar2 + 0x164) = uVar3;
          uv_poll_start(plVar12,uVar3,connection_poll_cb);
        }
      }
      else {
        close_socket(*(uv_os_sock_t *)(plVar2 + 0x27));
        uv_close(plVar2,connection_close_cb);
        uv_close(plVar2 + 0x14,connection_close_cb);
        *(undefined4 *)((long)plVar2 + 0x164) = 0;
      }
      iVar4 = *(int *)((long)plVar2 + 0x164);
      plVar13 = plVar12;
      iVar5 = uv_is_active();
      if (iVar4 == 0) {
        if (iVar5 == 0) {
          return iVar5;
        }
        goto LAB_00174563;
      }
      if (iVar5 == 1) {
        return iVar5;
      }
      connection_poll_cb_cold_16();
LAB_001740f0:
      iVar4 = rand();
      switch(iVar4 % 7) {
      case 0:
      case 1:
        do {
          plVar13 = (long *)(ulong)*(uint *)(plVar2 + 0x27);
          sVar8 = recv(*(uint *)(plVar2 + 0x27),connection_poll_cb::buffer,0x4a,0);
          uVar10 = (uint)sVar8;
          if (uVar10 != 0xffffffff) break;
          piVar9 = __errno_location();
        } while (*piVar9 == 4);
        if ((int)uVar10 < 0) goto LAB_0017456d;
        if (uVar10 == 0) goto LAB_001742c7;
        plVar2[0x28] = plVar2[0x28] + (ulong)(uVar10 & 0x7fffffff);
        goto switchD_00174131_caseD_4;
      case 2:
      case 3:
LAB_0017426c:
        plVar13 = (long *)(ulong)*(uint *)(plVar2 + 0x27);
        sVar8 = recv(*(uint *)(plVar2 + 0x27),connection_poll_cb::buffer_1,0x3a3,0);
        uVar10 = (uint)sVar8;
        if (uVar10 == 0xffffffff) goto code_r0x0017428a;
        goto LAB_00174294;
      case 4:
        goto switchD_00174131_caseD_4;
      case 5:
        uVar3 = uVar3 & 0xfffffffe;
        plVar13 = plVar2 + 0x14;
        plVar14 = plVar13;
        iVar4 = uv_is_active();
        if (iVar4 == 0) {
          *(undefined4 *)(plVar2 + 0x2d) = 1;
          uv_timer_start(plVar13,delay_timer_cb,10,0);
        }
        else {
          *(byte *)(plVar2 + 0x2d) = *(byte *)(plVar2 + 0x2d) | 1;
          plVar13 = plVar14;
        }
        goto switchD_00174131_caseD_4;
      case 6:
        uv_poll_start(plVar2,2,connection_poll_cb);
        plVar13 = plVar2;
        uv_poll_start(plVar2,1,connection_poll_cb);
        *(undefined4 *)((long)plVar2 + 0x164) = 1;
        goto switchD_00174131_caseD_4;
      default:
        goto switchD_00174131_default;
      }
    }
  }
  else {
LAB_00174554:
    connection_poll_cb_cold_1();
LAB_00174559:
    connection_poll_cb_cold_18();
  }
  connection_poll_cb_cold_2();
LAB_00174563:
  connection_poll_cb_cold_17();
LAB_00174568:
  connection_poll_cb_cold_6();
LAB_0017456d:
  connection_poll_cb_cold_4();
switchD_00174131_default:
  connection_poll_cb_cold_5();
LAB_00174577:
  connection_poll_cb_cold_14();
LAB_0017457c:
  connection_poll_cb_cold_11();
LAB_00174581:
  connection_poll_cb_cold_12();
LAB_00174586:
  connection_poll_cb_cold_9();
switchD_001741dd_default:
  connection_poll_cb_cold_15();
LAB_00174590:
  connection_poll_cb_cold_10();
  iVar4 = close((int)plVar13);
  if ((iVar4 == 0) || (piVar9 = __errno_location(), *piVar9 == 0x68)) {
    return extraout_EAX;
  }
  close_socket_cold_1();
  plVar12 = (long *)*plVar13;
  iVar4 = uv_is_active();
  if (iVar4 == 0) {
    if (*(uint *)(plVar12 + 0x2d) == 0) goto LAB_001745f7;
    uVar3 = *(uint *)(plVar12 + 0x2d) | *(uint *)((long)plVar12 + 0x164);
    *(uint *)((long)plVar12 + 0x164) = uVar3;
    *(undefined4 *)(plVar12 + 0x2d) = 0;
    iVar4 = uv_poll_start(plVar12,uVar3,connection_poll_cb);
    if (iVar4 == 0) {
      return 0;
    }
  }
  else {
    delay_timer_cb_cold_1();
LAB_001745f7:
    plVar12 = plVar13;
    delay_timer_cb_cold_3();
  }
  delay_timer_cb_cold_2();
  __ptr = (undefined8 *)*plVar12;
  piVar9 = (int *)((long)__ptr + 0x154);
  *piVar9 = *piVar9 + -1;
  if (*piVar9 != 0) {
    return extraout_EAX_00;
  }
  if ((test_mode == '\x01') && (*(int *)(__ptr + 0x2a) == 0)) {
    if (__ptr[0x28] != 0) {
      connection_close_cb_cold_2();
LAB_00174673:
      connection_close_cb_cold_1();
      goto LAB_00174678;
    }
  }
  else if (__ptr[0x28] != 0x10000) goto LAB_00174673;
  if ((test_mode != '\0') && (*(int *)(__ptr + 0x2a) != 0)) {
    if (__ptr[0x29] == 0) goto LAB_00174658;
    connection_close_cb_cold_3();
  }
  if (__ptr[0x29] != 0x10000) {
LAB_00174678:
    connection_close_cb_cold_4();
    free((void *)*__ptr);
    return extraout_EAX_02;
  }
LAB_00174658:
  closed_connections = closed_connections + 1;
  free(__ptr);
  return extraout_EAX_01;
code_r0x0017428a:
  piVar9 = __errno_location();
  if (*piVar9 == 4) goto LAB_0017426c;
LAB_00174294:
  if (0 < (int)uVar10) {
    plVar2[0x28] = plVar2[0x28] + (ulong)(uVar10 & 0x7fffffff);
    goto LAB_0017426c;
  }
  if (uVar10 != 0) {
    piVar9 = __errno_location();
    if ((*piVar9 == 0xb) || (*piVar9 == 0x73)) goto switchD_00174131_caseD_4;
    connection_poll_cb_cold_3();
  }
LAB_001742c7:
  *(undefined4 *)(plVar2 + 0x2b) = 1;
  uVar3 = uVar3 & 0xfffffffe;
  goto switchD_00174131_caseD_4;
}

Assistant:

static uv_os_sock_t create_bound_socket (struct sockaddr_in bind_addr) {
  uv_os_sock_t sock;
  int r;

  sock = socket(AF_INET, SOCK_STREAM, IPPROTO_IP);
#ifdef _WIN32
  ASSERT(sock != INVALID_SOCKET);
#else
  ASSERT(sock >= 0);
#endif

#ifndef _WIN32
  {
    /* Allow reuse of the port. */
    int yes = 1;
    r = setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, &yes, sizeof yes);
    ASSERT(r == 0);
  }
#endif

  r = bind(sock, (const struct sockaddr*) &bind_addr, sizeof bind_addr);
  ASSERT(r == 0);

  return sock;
}